

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

Cookie * Curl_cookie_getlist(CookieInfo *c,char *host,char *path,_Bool secure)

{
  char cVar1;
  char *__s;
  _Bool _Var2;
  byte bVar3;
  _Bool _Var4;
  int iVar5;
  time_t tVar6;
  size_t sVar7;
  Cookie *pCVar8;
  char *__s_00;
  char *pcVar9;
  size_t sVar10;
  undefined8 *__base;
  undefined8 *puVar11;
  long lVar12;
  Cookie *pCVar13;
  Cookie *pCVar14;
  Cookie *pCVar15;
  byte bVar16;
  size_t local_40;
  
  bVar16 = 0;
  tVar6 = time((time_t *)0x0);
  if (c == (CookieInfo *)0x0) {
    return (Cookie *)0x0;
  }
  if (c->cookies != (Cookie *)0x0) {
    remove_expired(c);
    _Var2 = isip(host);
    local_40 = 0;
    pCVar13 = (Cookie *)0x0;
LAB_004460c7:
    c = (CookieInfo *)((Cookie *)c)->next;
    if ((Cookie *)c != (Cookie *)0x0) {
      if (((((Cookie *)c)->expires == 0) || (tVar6 < ((Cookie *)c)->expires)) &&
         ((byte)(((Cookie *)c)->secure ^ 1U | secure) == 1)) {
        if (((Cookie *)c)->domain != (char *)0x0) {
          bVar3 = ((Cookie *)c)->tailmatch ^ 1;
          if ((bVar3 & 1) == 0 && !_Var2) {
            _Var4 = tailmatch(((Cookie *)c)->domain,host);
            if (_Var4) goto LAB_0044613c;
            bVar3 = ((Cookie *)c)->tailmatch ^ 1;
          }
          if (((bVar3 & 1) == 0 && !_Var2) ||
             (iVar5 = Curl_raw_equal(host,((Cookie *)c)->domain), iVar5 == 0)) goto LAB_004460c7;
        }
LAB_0044613c:
        __s = ((Cookie *)c)->spath;
        if ((__s != (char *)0x0) && (sVar7 = strlen(__s), sVar7 != 1)) {
          __s_00 = (*Curl_cstrdup)(path);
          if (__s_00 == (char *)0x0) goto LAB_004460c7;
          pcVar9 = strchr(__s_00,0x3f);
          if (pcVar9 != (char *)0x0) {
            *pcVar9 = '\0';
          }
          if (*__s_00 != '/') {
            (*Curl_cfree)(__s_00);
            __s_00 = (*Curl_cstrdup)("/");
            if (__s_00 == (char *)0x0) goto LAB_004460c7;
          }
          sVar10 = strlen(__s_00);
          if ((sVar10 < sVar7) || (iVar5 = strncmp(__s,__s_00,sVar7), iVar5 != 0)) {
            (*Curl_cfree)(__s_00);
            goto LAB_004460c7;
          }
          if (sVar7 == sVar10) {
            (*Curl_cfree)(__s_00);
          }
          else {
            cVar1 = __s_00[sVar7];
            (*Curl_cfree)(__s_00);
            if (cVar1 != '/') goto LAB_004460c7;
          }
        }
        pCVar8 = (Cookie *)(*Curl_cmalloc)(0x60);
        if (pCVar8 == (Cookie *)0x0) goto LAB_004462d3;
        pCVar14 = (Cookie *)c;
        pCVar15 = pCVar8;
        for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
          pCVar15->next = pCVar14->next;
          pCVar14 = (Cookie *)((long)pCVar14 + (ulong)bVar16 * -0x10 + 8);
          pCVar15 = (Cookie *)((long)pCVar15 + (ulong)bVar16 * -0x10 + 8);
        }
        pCVar8->next = pCVar13;
        local_40 = local_40 + 1;
        pCVar13 = pCVar8;
      }
      goto LAB_004460c7;
    }
    if (local_40 == 0) {
      return pCVar13;
    }
    __base = (undefined8 *)(*Curl_cmalloc)(local_40 * 8);
    puVar11 = __base;
    if (__base != (undefined8 *)0x0) {
      for (; pCVar13 != (Cookie *)0x0; pCVar13 = pCVar13->next) {
        *puVar11 = pCVar13;
        puVar11 = puVar11 + 1;
      }
      qsort(__base,local_40,8,cookie_sort);
      pCVar13 = (Cookie *)*__base;
      pCVar8 = pCVar13;
      for (sVar7 = 1; local_40 != sVar7; sVar7 = sVar7 + 1) {
        pCVar14 = (Cookie *)__base[sVar7];
        pCVar8->next = pCVar14;
        pCVar8 = pCVar14;
      }
      *(undefined8 *)__base[local_40 - 1] = 0;
      (*Curl_cfree)(__base);
      return pCVar13;
    }
LAB_004462d3:
    while (pCVar13 != (Cookie *)0x0) {
      pCVar8 = pCVar13->next;
      (*Curl_cfree)(pCVar13);
      pCVar13 = pCVar8;
    }
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  time_t now = time(NULL);
  struct Cookie *mainco=NULL;
  size_t matches = 0;
  bool is_ip;

  if(!c || !c->cookies)
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = isip(host);

  co = c->cookies;

  while(co) {
    /* only process this cookie if it is not expired or had no expire
       date AND that if the cookie requires we're secure we must only
       continue if we are! */
    if((!co->expires || (co->expires > now)) &&
       (co->secure?secure:TRUE)) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip && tailmatch(co->domain, host)) ||
         ((!co->tailmatch || is_ip) && Curl_raw_equal(host, co->domain)) ) {
        /* the right part of the host matches the domain stuff in the
           cookie data */

        /* now check the left part of the path with the cookies path
           requirement */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /* and now, we know this is a match and we should create an
             entry for the return-linked-list */

          newco = malloc(sizeof(struct Cookie));
          if(newco) {
            /* first, copy the whole source cookie: */
            memcpy(newco, co, sizeof(struct Cookie));

            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
          }
          else {
            fail:
            /* failure, clear up the allocated chain and return NULL */
            while(mainco) {
              co = mainco->next;
              free(mainco);
              mainco = co;
            }

            return NULL;
          }
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /* Now we need to make sure that if there is a name appearing more than
       once, the longest specified path version comes first. To make this
       the swiftest way, we just sort them all based on path length. */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i=0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i=0; i<matches-1; i++)
      array[i]->next = array[i+1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */
}